

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O3

bool __thiscall
DIS::IncomingMessage::FindProccessorContainer
          (IncomingMessage *this,uchar id,IPacketProcessor *pp,iterator *containerIter)

{
  _Self __tmp;
  _Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_> _Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>_>
  pVar2;
  uchar local_19;
  
  local_19 = id;
  pVar2 = std::
          _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>,_std::_Select1st<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>_>
          ::equal_range(&(this->_processors)._M_t,&local_19);
  _Var1 = pVar2.first._M_node;
  while( true ) {
    if (_Var1._M_node == pVar2.second._M_node._M_node) {
      return false;
    }
    if (_Var1._M_node[1]._M_parent == (_Base_ptr)pp) break;
    _Var1._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var1._M_node);
  }
  containerIter->_M_node = _Var1._M_node;
  return true;
}

Assistant:

bool IncomingMessage::FindProccessorContainer(unsigned char id, const IPacketProcessor* pp, PacketProcessorContainer::iterator &containerIter)
{  
   PacketProcessIteratorPair iterPair = _processors.equal_range(id);

   // Check to make sure that the processor we're trying to add is not already there
   while (iterPair.first != iterPair.second)
   {
      // If this processor with a matching id has a the exact same processor, bail
      if ((iterPair.first)->second == pp)
      {
         containerIter = iterPair.first;
         return true;
      }

      iterPair.first++;
   }

   // No matches were found in the loop
   return false;
}